

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_algoim_K.H
# Opt level: O0

void __thiscall
amrex::algoim::
ImplicitIntegral<1,_3,_amrex::algoim::EBPlane,_amrex::algoim::ImplicitIntegral<2,_3,_amrex::algoim::EBPlane,_amrex::algoim::ImplicitIntegral<3,_3,_amrex::algoim::EBPlane,_amrex::algoim::QuadratureRule,_true>,_false>,_false>
::evalIntegrand(ImplicitIntegral<1,_3,_amrex::algoim::EBPlane,_amrex::algoim::ImplicitIntegral<2,_3,_amrex::algoim::EBPlane,_amrex::algoim::ImplicitIntegral<3,_3,_amrex::algoim::EBPlane,_amrex::algoim::QuadratureRule,_true>,_false>,_false>
                *this,GpuArray<double,_3U> x,Real w)

{
  double *pdVar1;
  byte *pbVar2;
  long *in_RDI;
  ImplicitIntegral<2,_3,_amrex::algoim::EBPlane,_amrex::algoim::ImplicitIntegral<3,_3,_amrex::algoim::EBPlane,_amrex::algoim::QuadratureRule,_true>,_false>
  *in_XMM0_Qa;
  Real RVar3;
  Real RVar4;
  Real RVar5;
  double dVar6;
  GpuArray<double,_3U> in_stack_00000000;
  double in_stack_00000018;
  Real gw;
  int j_1;
  bool new_ok;
  int dim_1;
  int j;
  bool okay;
  int i_1;
  Real tol;
  Real xroot;
  Real phi_lo;
  int dim;
  int i;
  int nroots;
  Real x_max;
  Real x_min;
  GpuArray<double,_4U> roots;
  Real gauss_w [4];
  Real gauss_x [4];
  double c;
  undefined8 in_stack_fffffffffffffb50;
  int iVar7;
  bool local_49d;
  int local_49c;
  bool local_48d;
  int local_48c;
  byte *in_stack_fffffffffffffb78;
  undefined7 in_stack_fffffffffffffb80;
  undefined1 in_stack_fffffffffffffb87;
  undefined1 uVar8;
  int local_448;
  int local_440;
  int local_43c;
  bool local_435;
  int local_434;
  int local_414;
  int local_410;
  int local_40c;
  Real local_3f8;
  double local_3f0;
  double local_3e8;
  undefined8 local_3d8;
  undefined8 local_3d0;
  undefined8 local_3c8;
  undefined8 local_3c0;
  double local_3b8 [3];
  Real w_00;
  
  iVar7 = (int)((ulong)in_stack_fffffffffffffb50 >> 0x20);
  local_3b8[0] = 0.06943184420297371;
  local_3b8[1] = 0.33000947820757187;
  local_3b8[2] = 0.6699905217924281;
  w_00 = 0.9305681557970263;
  local_3d8 = 0x3fc64340f7e7b66b;
  local_3d0 = 0x3fd4de5f840c24ca;
  local_3c8 = 0x3fd4de5f840c24ca;
  local_3c0 = 0x3fc64340f7e7b66b;
  RVar3 = BoundingBox<3>::min(iVar7);
  RVar4 = BoundingBox<3>::max(iVar7);
  local_3f8 = RVar3;
  local_40c = 1;
  dVar6 = *(double *)(*in_RDI + 0x18 + (long)(int)in_RDI[4] * 8);
  if ((dVar6 != 0.0) || (NAN(dVar6))) {
    for (local_410 = 0; local_410 < (int)in_RDI[3]; local_410 = local_410 + 1) {
      for (local_414 = 0; local_414 < 3; local_414 = local_414 + 1) {
        if ((*(byte *)((long)in_RDI + (long)local_414 + 0x10) & 1) == 0) {
          RVar5 = BoundingBox<3>::operator()
                            ((BoundingBox<3> *)
                             CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80),
                             (int)((ulong)in_stack_fffffffffffffb78 >> 0x20),
                             (int)in_stack_fffffffffffffb78);
          *(Real *)(&stack0x00000008 + (long)local_414 * 8) = RVar5;
        }
      }
      *(Real *)(&stack0x00000008 + (long)(int)in_RDI[4] * 8) = RVar3;
      pdVar1 = (double *)*in_RDI;
      dVar6 = *(double *)(&stack0x00000008 + (long)(int)in_RDI[4] * 8) -
              ((in_stack_00000018 - pdVar1[2]) * pdVar1[5] +
              (in_stack_00000000.arr[1] - *pdVar1) * pdVar1[3] +
              (in_stack_00000000.arr[2] - pdVar1[1]) * pdVar1[4]) /
              *(double *)(*in_RDI + 0x18 + (long)(int)in_RDI[4] * 8);
      if ((RVar3 < dVar6) && (dVar6 < RVar4)) {
        (&local_3f8)[local_40c] = dVar6;
        local_40c = local_40c + 1;
      }
    }
  }
  dVar6 = local_3f0;
  if ((local_40c == 3) && (local_3e8 < local_3f0)) {
    local_3f0 = local_3e8;
    local_3e8 = dVar6;
  }
  (&local_3f8)[local_40c] = RVar4;
  for (local_434 = 0; local_434 < local_40c; local_434 = local_434 + 1) {
    if (1.1102230246251565e-14 <= (&local_3f8)[local_434 + 1] - (&local_3f8)[local_434]) {
      local_435 = true;
      *(double *)(&stack0x00000008 + (long)(int)in_RDI[4] * 8) =
           ((&local_3f8)[local_434] + (&local_3f8)[local_434 + 1]) * 0.5;
      local_43c = 0;
      while( true ) {
        uVar8 = false;
        if (local_43c < (int)in_RDI[3]) {
          uVar8 = local_435;
        }
        if ((bool)uVar8 == false) break;
        for (local_440 = 0; local_440 < 3; local_440 = local_440 + 1) {
          if ((*(byte *)((long)in_RDI + (long)local_440 + 0x10) & 1) == 0) {
            RVar3 = BoundingBox<3>::operator()
                              ((BoundingBox<3> *)CONCAT17(uVar8,in_stack_fffffffffffffb80),
                               (int)((ulong)in_stack_fffffffffffffb78 >> 0x20),
                               (int)in_stack_fffffffffffffb78);
            *(Real *)(&stack0x00000008 + (long)local_440 * 8) = RVar3;
          }
        }
        pdVar1 = (double *)*in_RDI;
        if ((in_stack_00000018 - pdVar1[2]) * pdVar1[5] +
            (in_stack_00000000.arr[1] - *pdVar1) * pdVar1[3] +
            (in_stack_00000000.arr[2] - pdVar1[1]) * pdVar1[4] <= 0.0) {
          pbVar2 = (byte *)((long)in_RDI + (long)local_43c + 0x13);
          if ((*pbVar2 & 8) == 0) {
            local_49c = -1;
            if ((*pbVar2 & 0x10) != 0) {
              local_49c = 1;
            }
          }
          else {
            local_49c = 0;
          }
          local_48d = local_49c < 1;
        }
        else {
          in_stack_fffffffffffffb78 = (byte *)((long)in_RDI + (long)local_43c + 0x13);
          if ((*in_stack_fffffffffffffb78 & 8) == 0) {
            local_48c = -1;
            if ((*in_stack_fffffffffffffb78 & 0x10) != 0) {
              local_48c = 1;
            }
          }
          else {
            local_48c = 0;
          }
          local_48d = -1 < local_48c;
        }
        local_49d = false;
        if (local_435 != false) {
          local_49d = local_48d;
        }
        local_435 = local_49d;
        local_43c = local_43c + 1;
      }
      if (local_435 != false) {
        for (local_448 = 0; local_448 < 4; local_448 = local_448 + 1) {
          *(double *)(&stack0x00000008 + (long)(int)in_RDI[4] * 8) =
               ((&local_3f8)[local_434 + 1] - (&local_3f8)[local_434]) * local_3b8[local_448] +
               (&local_3f8)[local_434];
          ImplicitIntegral<2,_3,_amrex::algoim::EBPlane,_amrex::algoim::ImplicitIntegral<3,_3,_amrex::algoim::EBPlane,_amrex::algoim::QuadratureRule,_true>,_false>
          ::evalIntegrand(in_XMM0_Qa,in_stack_00000000,w_00);
        }
      }
    }
  }
  return;
}

Assistant:

AMREX_GPU_HOST_DEVICE
    void evalIntegrand (GpuArray<Real,N> x, Real w) const noexcept
    {
        constexpr Real gauss_x[4]={0.069431844202973712388026755553595247452_rt,
                                   0.33000947820757186759866712044837765640_rt,
                                   0.66999052179242813240133287955162234360_rt,
                                   0.93056815579702628761197324444640475255_rt};
        constexpr Real gauss_w[4]={0.173927422568726928686531974610999703618_rt,
                                   0.326072577431273071313468025389000296382_rt,
                                   0.326072577431273071313468025389000296382_rt,
                                   0.173927422568726928686531974610999703618_rt};

        // Each thread has its own storage for computing roots. These
        // are not corrupted by the recursive chain of evalIntegrand()
        // calls since each call is in a different templated
        // namespace. Moreover, if using OpenMP tasking, each task is
        // assumed tied and so one thread can only execute
        // "evalIntegrand" from start to end uninterrupted.
        GpuArray<Real,4> roots;

        // Surface integral
        if (S)
        {
            AMREX_ASSERT(M == N && N >= 2); // x is thus valid in all variables except e0

            Real x_min = xrange.min(e0);
            Real x_max = xrange.max(e0);
            int nroots = 0;

            x[e0] = x_min;
            Real phi_lo = phi(x);
            Real xroot = x[e0] - phi_lo / phi.grad(e0);
            if (xroot > x_min && xroot < x_max) {
                roots[nroots++] = xroot;
            }

            AMREX_ASSERT(nroots <= 1);

            for (int i = 0; i < nroots; ++i)
            {
                x[e0] = roots[i];
                Real mag = 0._rt;
                for (int dim = 0; dim < N; ++dim) {
                    mag += phi.grad(dim)*phi.grad(dim);
                }
                mag = std::sqrt(mag);
                f.evalIntegrand(x, (mag/amrex::Math::abs(phi.grad(e0)))*w);
            }

            return;
        }

        // Partition [xmin(e0), xmax(e0)] by roots found
        Real x_min = xrange.min(e0);
        Real x_max = xrange.max(e0);
        roots[0] = x_min;
        int nroots = 1;
        if (phi.grad(e0) != Real(0.0)) {
            for (int i = 0; i < psiCount; ++i)
            {
                for (int dim = 0; dim < N; ++dim) {
                    if (!free[dim]) {
                        x[dim] = xrange(psi[i].side(dim),dim);
                    }
                }
                // x is now valid in all variables except e0
                x[e0] = x_min;
                Real phi_lo = phi(x);
                Real xroot = x[e0] - phi_lo / phi.grad(e0);
                if (xroot > x_min && xroot < x_max) {
                    roots[nroots++] = xroot;
                }
            }
            AMREX_ASSERT(nroots <= 3);
        }
        if (nroots == 3 && roots[1] > roots[2]) {
            detail::swap(roots[1],roots[2]);
        }
        roots[nroots++] = x_max;

        // In rare cases, degenerate segments can be found, filter out with a tolerance
        static constexpr Real eps = std::numeric_limits<Real>::epsilon();
        constexpr Real tol = 50.0*eps;

        // Loop over segments of divided interval
        for (int i = 0; i < nroots - 1; ++i)
        {
            if (roots[i+1] - roots[i] < tol) continue;

            // Evaluate sign of phi within segment and check for consistency with psi
            bool okay = true;
            x[e0] = (roots[i] + roots[i+1])*0.5;
            for (int j = 0; j < psiCount && okay; ++j)
            {
                for (int dim = 0; dim < N; ++dim) {
                    if (!free[dim]) {
                        x[dim] = xrange(psi[j].side(dim), dim);
                    }
                }
                bool new_ok = (phi(x) > 0.0) ? (psi[j].sign() >= 0) : (psi[j].sign() <= 0);
                okay = okay && new_ok;
            }
            if (!okay) continue;

            for (int j = 0; j < p; ++j)
            {
                x[e0] = roots[i] + (roots[i+1] - roots[i]) * gauss_x[j];
                Real gw = (roots[i+1] - roots[i]) * gauss_w[j];
                f.evalIntegrand(x, w * gw);
            }
        }
    }